

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnViewPrivate::changeCurrentColumn(QColumnViewPrivate *this)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  Promoted<int,_long_long> PVar4;
  const_reference ppQVar5;
  long lVar6;
  QItemSelectionModel *pQVar7;
  QItemSelectionModel *pQVar8;
  QAbstractItemModel *pQVar9;
  QAbstractItemView **ppQVar10;
  QColumnViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemView *view;
  QItemSelectionModel *replacementSelectionModel;
  int i;
  QAbstractItemView *parentColumn;
  int currentColumn;
  QColumnView *q;
  QModelIndex newRootIndex;
  QModelIndex current;
  QModelIndex *in_stack_fffffffffffffeb8;
  QModelIndex *pQVar11;
  QWidget *in_stack_fffffffffffffec0;
  QWidget *w;
  QModelIndex *in_stack_fffffffffffffec8;
  QModelIndex *in_stack_fffffffffffffed0;
  QWidget *in_stack_fffffffffffffed8;
  QModelIndex *in_stack_fffffffffffffef8;
  FocusReason reason;
  QColumnViewPrivate *in_stack_ffffffffffffff00;
  QModelIndex *pQVar12;
  undefined4 in_stack_ffffffffffffff08;
  int iVar13;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 local_6c;
  undefined1 local_68 [28];
  undefined4 local_4c;
  undefined1 local_48 [24];
  long local_30;
  int local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  bVar1 = QList<QAbstractItemView_*>::isEmpty((QList<QAbstractItemView_*> *)0x8612b6);
  if (!bVar1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::currentIndex((QAbstractItemView *)in_stack_fffffffffffffed0);
    bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffec0);
    if (bVar1) {
      closeColumns(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                   SUB81((ulong)in_RDI >> 0x38,0));
      reason = (FocusReason)((ulong)in_stack_fffffffffffffef8 >> 0x20);
      local_24 = 0;
      qVar3 = QList<QAbstractItemView_*>::size(&in_RDI->columns);
      local_30 = qVar3 + -2;
      PVar4 = qMax<int,long_long>(&local_24,&local_30);
      iVar2 = (int)PVar4;
      ppQVar5 = QList<QAbstractItemView_*>::at
                          ((QList<QAbstractItemView_*> *)in_stack_fffffffffffffec0,
                           (qsizetype)in_stack_fffffffffffffeb8);
      w = (QWidget *)*ppQVar5;
      bVar1 = QWidget::hasFocus(in_stack_fffffffffffffed8);
      if (bVar1) {
        QWidget::setFocus((QWidget *)in_stack_ffffffffffffff00,reason);
      }
      QWidget::setFocusProxy((QWidget *)CONCAT44(iVar2,in_stack_ffffffffffffff18),w);
      for (iVar13 = 0; lVar6 = (long)iVar13,
          qVar3 = QList<QAbstractItemView_*>::size(&in_RDI->columns), lVar6 < qVar3;
          iVar13 = iVar13 + 1) {
        QList<QAbstractItemView_*>::at
                  ((QList<QAbstractItemView_*> *)in_stack_fffffffffffffec0,
                   (qsizetype)in_stack_fffffffffffffeb8);
        pQVar7 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffec0);
        pQVar8 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffec0);
        if (pQVar7 == pQVar8) {
          in_stack_fffffffffffffec8 = (QModelIndex *)operator_new(0x10);
          pQVar9 = QAbstractItemView::model((QAbstractItemView *)in_stack_fffffffffffffed0);
          QItemSelectionModel::QItemSelectionModel
                    ((QItemSelectionModel *)in_stack_fffffffffffffec8,pQVar9);
          in_stack_fffffffffffffed0 = in_stack_fffffffffffffec8;
          pQVar11 = in_stack_fffffffffffffec8;
          QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffec0);
          QItemSelectionModel::currentIndex();
          QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                    ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffec0,
                     (SelectionFlag)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
          (**(code **)(*(long *)in_stack_fffffffffffffed0 + 0x60))
                    (in_stack_fffffffffffffed0,local_48,local_4c);
          pQVar12 = pQVar11;
          QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffec0);
          QItemSelectionModel::selection();
          QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                    ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffec0,
                     (SelectionFlag)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
          (**(code **)(*(long *)pQVar11 + 0x70))(pQVar11,local_68,local_6c);
          QItemSelection::~QItemSelection((QItemSelection *)0x861509);
          ppQVar5 = QList<QAbstractItemView_*>::at
                              ((QList<QAbstractItemView_*> *)in_stack_fffffffffffffec0,
                               (qsizetype)in_stack_fffffffffffffeb8);
          (**(code **)(*(long *)&((*ppQVar5)->super_QAbstractScrollArea).super_QFrame.super_QWidget
                      + 0x1d0))(*ppQVar5,pQVar12);
          QWidget::setFocusPolicy
                    (in_stack_fffffffffffffec0,
                     (FocusPolicy)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
          qVar3 = QList<QAbstractItemView_*>::size(&in_RDI->columns);
          if (iVar13 + 1 < qVar3) {
            QList<QAbstractItemView_*>::at
                      ((QList<QAbstractItemView_*> *)in_stack_fffffffffffffec0,
                       (qsizetype)in_stack_fffffffffffffeb8);
            QAbstractItemView::rootIndex((QAbstractItemView *)in_stack_fffffffffffffec0);
            bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffec0);
            if (bVar1) {
              QAbstractItemView::setCurrentIndex
                        ((QAbstractItemView *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
            }
          }
          break;
        }
      }
      QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffec0);
      QObject::deleteLater();
      QWidget::setFocusPolicy
                (in_stack_fffffffffffffec0,(FocusPolicy)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      pQVar7 = QAbstractItemView::selectionModel((QAbstractItemView *)w);
      (**(code **)(*(long *)w + 0x1d0))(w,pQVar7);
      if (0 < iVar2) {
        ppQVar5 = QList<QAbstractItemView_*>::at
                            ((QList<QAbstractItemView_*> *)w,(qsizetype)in_stack_fffffffffffffeb8);
        pQVar11 = (QModelIndex *)*ppQVar5;
        QAbstractItemView::currentIndex((QAbstractItemView *)in_stack_fffffffffffffed0);
        QModelIndex::parent(in_stack_fffffffffffffed0);
        bVar1 = ::operator!=((QModelIndex *)w,in_stack_fffffffffffffeb8);
        if (bVar1) {
          QModelIndex::parent(in_stack_fffffffffffffed0);
          QAbstractItemView::setCurrentIndex
                    ((QAbstractItemView *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          in_stack_fffffffffffffeb8 = pQVar11;
        }
      }
      QList<QAbstractItemView_*>::constLast((QList<QAbstractItemView_*> *)in_stack_fffffffffffffeb8)
      ;
      bVar1 = QWidget::isHidden((QWidget *)0x8616f3);
      if (bVar1) {
        ppQVar10 = QList<QAbstractItemView_*>::constLast
                             ((QList<QAbstractItemView_*> *)in_stack_fffffffffffffeb8);
        (**(code **)(*(long *)&((*ppQVar10)->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                    0x68))(*ppQVar10,1);
      }
      QList<QAbstractItemView_*>::constLast((QList<QAbstractItemView_*> *)in_stack_fffffffffffffeb8)
      ;
      pQVar7 = QAbstractItemView::selectionModel((QAbstractItemView *)w);
      if (pQVar7 != (QItemSelectionModel *)0x0) {
        QList<QAbstractItemView_*>::constLast
                  ((QList<QAbstractItemView_*> *)in_stack_fffffffffffffeb8);
        pQVar7 = QAbstractItemView::selectionModel((QAbstractItemView *)w);
        (**(code **)(*(long *)pQVar7 + 0x78))();
      }
      updateScrollbars((QColumnViewPrivate *)CONCAT44(iVar13,in_stack_ffffffffffffff08));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnViewPrivate::changeCurrentColumn()
{
    Q_Q(QColumnView);
    if (columns.isEmpty())
        return;

    QModelIndex current = q->currentIndex();
    if (!current.isValid())
        return;

    // We might have scrolled far to the left so we need to close all of the children
    closeColumns(current, true);

    // Set up the "current" column with focus
    int currentColumn = qMax(0, columns.size() - 2);
    QAbstractItemView *parentColumn = columns.at(currentColumn);
    if (q->hasFocus())
        parentColumn->setFocus(Qt::OtherFocusReason);
    q->setFocusProxy(parentColumn);

    // find the column that is our current selection model and give it a new one.
    for (int i = 0; i < columns.size(); ++i) {
        if (columns.at(i)->selectionModel() == q->selectionModel()) {
            QItemSelectionModel *replacementSelectionModel =
                new QItemSelectionModel(parentColumn->model());
            replacementSelectionModel->setCurrentIndex(
                q->selectionModel()->currentIndex(), QItemSelectionModel::Current);
            replacementSelectionModel->select(
                q->selectionModel()->selection(), QItemSelectionModel::Select);
            QAbstractItemView *view = columns.at(i);
            view->setSelectionModel(replacementSelectionModel);
            view->setFocusPolicy(Qt::NoFocus);
            if (columns.size() > i + 1) {
                const QModelIndex newRootIndex = columns.at(i + 1)->rootIndex();
                if (newRootIndex.isValid())
                    view->setCurrentIndex(newRootIndex);
            }
            break;
        }
    }
    parentColumn->selectionModel()->deleteLater();
    parentColumn->setFocusPolicy(Qt::StrongFocus);
    parentColumn->setSelectionModel(q->selectionModel());
    // We want the parent selection to stay highlighted (but dimmed depending upon the color theme)
    if (currentColumn > 0) {
        parentColumn = columns.at(currentColumn - 1);
        if (parentColumn->currentIndex() != current.parent())
            parentColumn->setCurrentIndex(current.parent());
    }

    if (columns.constLast()->isHidden()) {
        columns.constLast()->setVisible(true);
    }
    if (columns.constLast()->selectionModel())
        columns.constLast()->selectionModel()->clear();
    updateScrollbars();
}